

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall
MT32Emu::RendererImpl<short>::doRenderAndConvertStreams<float>
          (RendererImpl<short> *this,DACOutputStreams<float> *streams,Bit32u len)

{
  short sVar1;
  short *psVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  ulong uVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  DACOutputStreams<short> cnvStreams;
  short cnvReverbWetRight [4096];
  short cnvReverbWetLeft [4096];
  short cnvReverbDryRight [4096];
  short cnvReverbDryLeft [4096];
  short cnvNonReverbRight [4096];
  short cnvNonReverbLeft [4096];
  DACOutputStreams<short> local_c078;
  RendererImpl<short> *local_c048;
  float *local_c040;
  short local_c038 [4096];
  short local_a038 [4096];
  short local_8038 [4096];
  short local_6038 [4096];
  short local_4038 [4096];
  short local_2038 [4100];
  
  local_c078.nonReverbLeft = local_2038;
  local_c078.nonReverbRight = local_4038;
  local_c078.reverbDryLeft = local_6038;
  local_c078.reverbDryRight = local_8038;
  local_c078.reverbWetLeft = local_a038;
  local_c078.reverbWetRight = local_c038;
  if (len != 0) {
    local_c040 = streams->reverbWetRight;
    pfVar7 = streams->reverbWetLeft;
    pfVar9 = streams->reverbDryRight;
    pfVar8 = streams->reverbDryLeft;
    pfVar4 = streams->nonReverbLeft;
    pfVar3 = streams->nonReverbRight;
    local_c048 = this;
    do {
      uVar6 = 0x1000;
      if (len < 0x1000) {
        uVar6 = (ulong)len;
      }
      doRenderStreams(local_c048,&local_c078,(Bit32u)uVar6);
      if (pfVar4 != (float *)0x0 && local_c078.nonReverbLeft != (short *)0x0) {
        psVar2 = local_c078.nonReverbLeft;
        pfVar5 = pfVar4;
        do {
          sVar1 = *psVar2;
          psVar2 = psVar2 + 1;
          *pfVar5 = (float)(int)sVar1 * 3.0517578e-05;
          pfVar5 = pfVar5 + 1;
        } while (psVar2 < local_c078.nonReverbLeft + uVar6);
      }
      if (pfVar3 != (float *)0x0 && local_c078.nonReverbRight != (short *)0x0) {
        psVar2 = local_c078.nonReverbRight;
        pfVar5 = pfVar3;
        do {
          sVar1 = *psVar2;
          psVar2 = psVar2 + 1;
          *pfVar5 = (float)(int)sVar1 * 3.0517578e-05;
          pfVar5 = pfVar5 + 1;
        } while (psVar2 < local_c078.nonReverbRight + uVar6);
      }
      if (pfVar8 != (float *)0x0 && local_c078.reverbDryLeft != (short *)0x0) {
        psVar2 = local_c078.reverbDryLeft;
        pfVar5 = pfVar8;
        do {
          sVar1 = *psVar2;
          psVar2 = psVar2 + 1;
          *pfVar5 = (float)(int)sVar1 * 3.0517578e-05;
          pfVar5 = pfVar5 + 1;
        } while (psVar2 < local_c078.reverbDryLeft + uVar6);
      }
      if (pfVar9 != (float *)0x0 && local_c078.reverbDryRight != (short *)0x0) {
        psVar2 = local_c078.reverbDryRight;
        pfVar5 = pfVar9;
        do {
          sVar1 = *psVar2;
          psVar2 = psVar2 + 1;
          *pfVar5 = (float)(int)sVar1 * 3.0517578e-05;
          pfVar5 = pfVar5 + 1;
        } while (psVar2 < local_c078.reverbDryRight + uVar6);
      }
      if (pfVar7 != (float *)0x0 && local_c078.reverbWetLeft != (short *)0x0) {
        psVar2 = local_c078.reverbWetLeft;
        pfVar5 = pfVar7;
        do {
          sVar1 = *psVar2;
          psVar2 = psVar2 + 1;
          *pfVar5 = (float)(int)sVar1 * 3.0517578e-05;
          pfVar5 = pfVar5 + 1;
        } while (psVar2 < local_c078.reverbWetLeft + uVar6);
      }
      if (local_c040 != (float *)0x0 && local_c078.reverbWetRight != (short *)0x0) {
        psVar2 = local_c078.reverbWetRight;
        pfVar5 = local_c040;
        do {
          sVar1 = *psVar2;
          psVar2 = psVar2 + 1;
          *pfVar5 = (float)(int)sVar1 * 3.0517578e-05;
          pfVar5 = pfVar5 + 1;
        } while (psVar2 < local_c078.reverbWetRight + uVar6);
      }
      if (pfVar4 != (float *)0x0) {
        pfVar4 = pfVar4 + uVar6;
      }
      if (pfVar3 != (float *)0x0) {
        pfVar3 = pfVar3 + uVar6;
      }
      if (pfVar8 != (float *)0x0) {
        pfVar8 = pfVar8 + uVar6;
      }
      if (pfVar9 != (float *)0x0) {
        pfVar9 = pfVar9 + uVar6;
      }
      if (pfVar7 != (float *)0x0) {
        pfVar7 = pfVar7 + uVar6;
      }
      if (local_c040 != (float *)0x0) {
        local_c040 = local_c040 + uVar6;
      }
      len = len - (Bit32u)uVar6;
    } while (len != 0);
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRenderAndConvertStreams(const DACOutputStreams<O> &streams, Bit32u len) {
	Sample cnvNonReverbLeft[MAX_SAMPLES_PER_RUN], cnvNonReverbRight[MAX_SAMPLES_PER_RUN];
	Sample cnvReverbDryLeft[MAX_SAMPLES_PER_RUN], cnvReverbDryRight[MAX_SAMPLES_PER_RUN];
	Sample cnvReverbWetLeft[MAX_SAMPLES_PER_RUN], cnvReverbWetRight[MAX_SAMPLES_PER_RUN];

	const DACOutputStreams<Sample> cnvStreams = {
		cnvNonReverbLeft, cnvNonReverbRight,
		cnvReverbDryLeft, cnvReverbDryRight,
		cnvReverbWetLeft, cnvReverbWetRight
	};

	DACOutputStreams<O> tmpStreams = streams;

	while (len > 0) {
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRenderStreams(cnvStreams, thisPassLen);
		convertStreamsFormat(cnvStreams, tmpStreams, thisPassLen);
		advanceStreams(tmpStreams, thisPassLen);
		len -= thisPassLen;
	}
}